

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# age.cpp
# Opt level: O0

void duckdb::AgeFunction(DataChunk *input,ExpressionState *state,Vector *result)

{
  reference __n;
  reference pvVar1;
  idx_t iVar2;
  undefined8 in_RDX;
  DataChunk *in_RDI;
  size_type in_stack_ffffffffffffffc8;
  vector<duckdb::Vector,_true> *in_stack_ffffffffffffffd0;
  
  __n = vector<duckdb::Vector,_true>::operator[]
                  (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  pvVar1 = vector<duckdb::Vector,_true>::operator[](in_stack_ffffffffffffffd0,(size_type)__n);
  iVar2 = DataChunk::size(in_RDI);
  BinaryExecutor::
  ExecuteWithNulls<duckdb::timestamp_t,duckdb::timestamp_t,duckdb::interval_t,duckdb::AgeFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0>
            (__n,pvVar1,in_RDX,iVar2);
  return;
}

Assistant:

static void AgeFunction(DataChunk &input, ExpressionState &state, Vector &result) {
	D_ASSERT(input.ColumnCount() == 2);

	BinaryExecutor::ExecuteWithNulls<timestamp_t, timestamp_t, interval_t>(
	    input.data[0], input.data[1], result, input.size(),
	    [&](timestamp_t input1, timestamp_t input2, ValidityMask &mask, idx_t idx) {
		    if (Timestamp::IsFinite(input1) && Timestamp::IsFinite(input2)) {
			    return Interval::GetAge(input1, input2);
		    } else {
			    mask.SetInvalid(idx);
			    return interval_t();
		    }
	    });
}